

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.h
# Opt level: O1

bool absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<absl::lts_20250127::int128>
               (Data arg,FormatConversionSpecImpl spec,void *out)

{
  bool bVar1;
  undefined1 in_stack_00000008 [16];
  
  if ((spec.conv_ != (v|s)) && ((2L << (spec.conv_ & 0x3f) & 0x9fffaU) != 0)) {
    bVar1 = ConvertIntArg<absl::lts_20250127::int128>((int128)in_stack_00000008,*arg.ptr,spec._0_8_)
    ;
    return bVar1;
  }
  return false;
}

Assistant:

static bool Dispatch(Data arg, FormatConversionSpecImpl spec, void* out) {
    // A `none` conv indicates that we want the `int` conversion.
    if (ABSL_PREDICT_FALSE(spec.conversion_char() ==
                           FormatConversionCharInternal::kNone)) {
      return ToInt<T>(arg, static_cast<int*>(out), std::is_integral<T>(),
                      std::is_enum<T>());
    }
    if (ABSL_PREDICT_FALSE(!Contains(ArgumentToConv<T>(),
                                     spec.conversion_char()))) {
      return false;
    }
    return str_format_internal::FormatConvertImpl(
               Manager<T>::Value(arg), spec,
               static_cast<FormatSinkImpl*>(out))
        .value;
  }